

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_when_ctx_node
              (lyd_node *node,lys_node *schema,lyd_node **ctx_node,lyxp_node_type *ctx_node_type)

{
  lyd_node *local_58;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  lyxp_node_type lStack_44;
  uint16_t schema_depth;
  uint16_t data_depth;
  uint16_t i;
  lyxp_node_type node_type;
  lys_node *sparent;
  lyd_node *parent;
  lyxp_node_type *ctx_node_type_local;
  lyd_node **ctx_node_local;
  lys_node *schema_local;
  lyd_node *node_local;
  
  parent = (lyd_node *)ctx_node_type;
  ctx_node_type_local = (lyxp_node_type *)ctx_node;
  ctx_node_local = (lyd_node **)schema;
  schema_local = (lys_node *)node;
  resolve_when_ctx_snode(schema,(lys_node **)&ctx_node_local,&stack0xffffffffffffffbc);
  if (lStack_44 == LYXP_NODE_ELEM) {
    local_48 = 0;
    for (sparent = schema_local; sparent != (lys_node *)0x0;
        sparent = (lys_node *)sparent->iffeature) {
      local_48 = local_48 + 1;
    }
    local_4a = 0;
    _data_depth = (lyd_node *)ctx_node_local;
    while (_data_depth != (lyd_node *)0x0) {
      if (((ulong)*(lyd_node **)(_data_depth + 1) & 0x81bd) != 0) {
        local_4a = local_4a + 1;
      }
      if (*(int *)(_data_depth + 1) == 0x2000) {
        local_58 = *(lyd_node **)((long)(_data_depth + 1) + 0x20);
      }
      else {
        local_58 = *(lyd_node **)((long)(_data_depth + 1) + 8);
      }
      _data_depth = local_58;
    }
    if (local_48 < local_4a) {
      return -1;
    }
    for (local_46 = 0; (int)(uint)local_46 < (int)((uint)local_48 - (uint)local_4a);
        local_46 = local_46 + 1) {
      schema_local = (lys_node *)schema_local->iffeature;
    }
    if ((lyd_node **)schema_local->name != ctx_node_local) {
      return -1;
    }
  }
  else {
    for (; schema_local->iffeature != (lys_iffeature *)0x0;
        schema_local = (lys_node *)schema_local->iffeature) {
    }
    while (schema_local->ext[3] != (lys_ext_instance *)0x0) {
      schema_local = (lys_node *)schema_local->ext;
    }
  }
  *(lys_node **)ctx_node_type_local = schema_local;
  *(lyxp_node_type *)&parent->schema = lStack_44;
  return 0;
}

Assistant:

static int
resolve_when_ctx_node(struct lyd_node *node, struct lys_node *schema, struct lyd_node **ctx_node,
                      enum lyxp_node_type *ctx_node_type)
{
    struct lyd_node *parent;
    struct lys_node *sparent;
    enum lyxp_node_type node_type;
    uint16_t i, data_depth, schema_depth;

    resolve_when_ctx_snode(schema, &schema, &node_type);

    if (node_type == LYXP_NODE_ELEM) {
        /* standard element context node */
        for (parent = node, data_depth = 0; parent; parent = parent->parent, ++data_depth);
        for (sparent = schema, schema_depth = 0;
                sparent;
                sparent = (sparent->nodetype == LYS_AUGMENT ? ((struct lys_node_augment *)sparent)->target : sparent->parent)) {
            if (sparent->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC)) {
                ++schema_depth;
            }
        }
        if (data_depth < schema_depth) {
            return -1;
        }

        /* find the corresponding data node */
        for (i = 0; i < data_depth - schema_depth; ++i) {
            node = node->parent;
        }
        if (node->schema != schema) {
            return -1;
        }
    } else {
        /* root context node */
        while (node->parent) {
            node = node->parent;
        }
        while (node->prev->next) {
            node = node->prev;
        }
    }

    *ctx_node = node;
    *ctx_node_type = node_type;
    return EXIT_SUCCESS;
}